

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O2

int32_t ucol_getDisplayName_63
                  (char *objLoc,char *dispLoc,UChar *result,int32_t resultLength,UErrorCode *status)

{
  int32_t iVar1;
  Char16Ptr local_240;
  UChar *local_238;
  UnicodeString dst;
  Locale local_1e8;
  Locale local_108;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    dst.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
    dst.fUnion.fStackFields.fLengthAndFlags = 2;
    if (result != (UChar *)0x0 || resultLength != 0) {
      icu_63::UnicodeString::setTo(&dst,result,0,resultLength);
    }
    icu_63::Locale::Locale(&local_108,objLoc,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Locale::Locale(&local_1e8,dispLoc,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::Collator::getDisplayName(&local_108,&local_1e8,&dst);
    icu_63::Locale::~Locale(&local_1e8);
    icu_63::Locale::~Locale(&local_108);
    local_240.p_ = result;
    iVar1 = icu_63::UnicodeString::extract(&dst,&local_240,resultLength,status);
    local_238 = local_240.p_;
    icu_63::UnicodeString::~UnicodeString(&dst);
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}